

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

int xmlSchematronValidateDoc(xmlSchematronValidCtxtPtr ctxt,xmlDocPtr instance)

{
  int iVar1;
  xmlNodePtr pxVar2;
  xmlSchematronTestPtr_conflict local_48;
  xmlSchematronTestPtr_conflict test;
  xmlSchematronRulePtr_conflict rule;
  xmlSchematronPatternPtr_conflict pattern;
  xmlNodePtr root;
  xmlNodePtr cur;
  xmlDocPtr instance_local;
  xmlSchematronValidCtxtPtr ctxt_local;
  
  if ((((ctxt == (xmlSchematronValidCtxtPtr)0x0) || (ctxt->schema == (xmlSchematronPtr)0x0)) ||
      (ctxt->schema->rules == (xmlSchematronRulePtr_conflict)0x0)) || (instance == (xmlDocPtr)0x0))
  {
    ctxt_local._4_4_ = -1;
  }
  else {
    ctxt->nberrors = 0;
    pxVar2 = xmlDocGetRootElement(instance);
    if (pxVar2 == (xmlNodePtr)0x0) {
      ctxt->nberrors = ctxt->nberrors + 1;
      ctxt_local._4_4_ = 1;
    }
    else {
      root = pxVar2;
      if (((ctxt->flags & 1U) == 0) && (ctxt->flags != 0)) {
        for (rule = (xmlSchematronRulePtr_conflict)ctxt->schema->patterns;
            rule != (xmlSchematronRulePtr_conflict)0x0; rule = rule->next) {
          xmlSchematronReportPattern(ctxt,(xmlSchematronPatternPtr_conflict)rule);
          for (root = pxVar2; root != (xmlNodePtr)0x0; root = xmlSchematronNextNode(root)) {
            for (test = (xmlSchematronTestPtr_conflict)rule->patnext;
                test != (xmlSchematronTestPtr_conflict)0x0;
                test = *(xmlSchematronTestPtr_conflict *)&test->type) {
              iVar1 = xmlPatternMatch((xmlPatternPtr)test->report,root);
              if (iVar1 == 1) {
                local_48 = (xmlSchematronTestPtr_conflict)test->comp;
                xmlSchematronRegisterVariables
                          (ctxt,ctxt->xctxt,*(xmlSchematronLetPtr_conflict *)&test[1].type,instance,
                           root);
                for (; local_48 != (xmlSchematronTestPtr_conflict)0x0; local_48 = local_48->next) {
                  xmlSchematronRunTest
                            (ctxt,local_48,instance,root,(xmlSchematronPatternPtr_conflict)rule);
                }
                xmlSchematronUnregisterVariables
                          (ctxt,ctxt->xctxt,*(xmlSchematronLetPtr_conflict *)&test[1].type);
              }
            }
          }
        }
      }
      else {
        for (; root != (xmlNodePtr)0x0; root = xmlSchematronNextNode(root)) {
          for (test = (xmlSchematronTestPtr_conflict)ctxt->schema->rules;
              test != (xmlSchematronTestPtr_conflict)0x0; test = test->next) {
            iVar1 = xmlPatternMatch((xmlPatternPtr)test->report,root);
            if (iVar1 == 1) {
              local_48 = (xmlSchematronTestPtr_conflict)test->comp;
              iVar1 = xmlSchematronRegisterVariables
                                (ctxt,ctxt->xctxt,*(xmlSchematronLetPtr_conflict *)&test[1].type,
                                 instance,root);
              if (iVar1 != 0) {
                return -1;
              }
              for (; local_48 != (xmlSchematronTestPtr_conflict)0x0; local_48 = local_48->next) {
                xmlSchematronRunTest
                          (ctxt,local_48,instance,root,
                           (xmlSchematronPatternPtr_conflict)test->report);
              }
              iVar1 = xmlSchematronUnregisterVariables
                                (ctxt,ctxt->xctxt,*(xmlSchematronLetPtr_conflict *)&test[1].type);
              if (iVar1 != 0) {
                return -1;
              }
            }
          }
        }
      }
      ctxt_local._4_4_ = ctxt->nberrors;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlSchematronValidateDoc(xmlSchematronValidCtxtPtr ctxt, xmlDocPtr instance)
{
    xmlNodePtr cur, root;
    xmlSchematronPatternPtr pattern;
    xmlSchematronRulePtr rule;
    xmlSchematronTestPtr test;

    if ((ctxt == NULL) || (ctxt->schema == NULL) ||
        (ctxt->schema->rules == NULL) || (instance == NULL))
        return(-1);
    ctxt->nberrors = 0;
    root = xmlDocGetRootElement(instance);
    if (root == NULL) {
        /* TODO */
        ctxt->nberrors++;
        return(1);
    }
    if ((ctxt->flags & XML_SCHEMATRON_OUT_QUIET) ||
        (ctxt->flags == 0)) {
        /*
         * we are just trying to assert the validity of the document,
         * speed primes over the output, run in a single pass
         */
        cur = root;
        while (cur != NULL) {
            rule = ctxt->schema->rules;
            while (rule != NULL) {
                if (xmlPatternMatch(rule->pattern, cur) == 1) {
                    test = rule->tests;

                    if (xmlSchematronRegisterVariables(ctxt, ctxt->xctxt,
                                rule->lets, instance, cur))
                        return -1;

                    while (test != NULL) {
                        xmlSchematronRunTest(ctxt, test, instance, cur, (xmlSchematronPatternPtr)rule->pattern);
                        test = test->next;
                    }

                    if (xmlSchematronUnregisterVariables(ctxt, ctxt->xctxt,
                                rule->lets))
                        return -1;

                }
                rule = rule->next;
            }

            cur = xmlSchematronNextNode(cur);
        }
    } else {
        /*
         * Process all contexts one at a time
         */
        pattern = ctxt->schema->patterns;

        while (pattern != NULL) {
            xmlSchematronReportPattern(ctxt, pattern);

            /*
             * TODO convert the pattern rule to a direct XPath and
             * compute directly instead of using the pattern matching
             * over the full document...
             * Check the exact semantic
             */
            cur = root;
            while (cur != NULL) {
                rule = pattern->rules;
                while (rule != NULL) {
                    if (xmlPatternMatch(rule->pattern, cur) == 1) {
                        test = rule->tests;
                        xmlSchematronRegisterVariables(ctxt, ctxt->xctxt,
                                rule->lets, instance, cur);

                        while (test != NULL) {
                            xmlSchematronRunTest(ctxt, test, instance, cur, pattern);
                            test = test->next;
                        }

                        xmlSchematronUnregisterVariables(ctxt, ctxt->xctxt,
                                rule->lets);
                    }
                    rule = rule->patnext;
                }

                cur = xmlSchematronNextNode(cur);
            }
            pattern = pattern->next;
        }
    }
    return(ctxt->nberrors);
}